

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O0

bool __thiscall tsip::save_to_eeprom(tsip *this,int seg_num)

{
  _command_packet _cmd;
  bool bVar1;
  undefined1 in_SIL;
  long in_RDI;
  tsip *in_stack_00000070;
  undefined1 in_stack_00000080 [28];
  bool rc;
  undefined1 in_stack_000000a8 [28];
  undefined1 local_58 [88];
  
  *(undefined1 *)(in_RDI + 0x578) = 0x8e;
  *(undefined1 *)(in_RDI + 0x579) = 0x4c;
  *(undefined1 *)(in_RDI + 0x57a) = in_SIL;
  *(undefined1 *)(in_RDI + 0x5b8) = 3;
  memcpy(local_58,(void *)(in_RDI + 0x578),0x44);
  _cmd._28_4_ = seg_num;
  _cmd._0_28_ = in_stack_00000080;
  _cmd._32_8_ = this;
  _cmd._40_28_ = in_stack_000000a8;
  bVar1 = send_request_msg(in_stack_00000070,_cmd);
  return bVar1;
}

Assistant:

bool tsip::save_to_eeprom(int seg_num=0xff) {
	bool rc;

	//build 8E- request - set autosave
	m_command.extended.code = COMMAND_SUPER_PACKET;
	m_command.extended.subcode = COMMAND_SAVE_EEPROM ;
	m_command.extended.data[0] = seg_num;

	m_command.extended.cmd_len = 3;

	rc = send_request_msg(m_command);
	return rc;
}